

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_metadata.cpp
# Opt level: O2

string * __thiscall
handlegraph::PathMetadata::get_sample_name_abi_cxx11_
          (string *__return_storage_ptr__,PathMetadata *this,path_handle_t *handle)

{
  string local_30;
  
  (*this->_vptr_PathMetadata[10])(&local_30);
  parse_sample_name(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string PathMetadata::get_sample_name(const path_handle_t& handle) const {
    return PathMetadata::parse_sample_name(get_path_name(handle));
}